

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Array.hpp
# Opt level: O3

LoopItem * __thiscall
Qentem::
Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>::
allocate(Array<Qentem::TemplateCore<char,_Qentem::Value<char>,_Qentem::StringStream<char>_>::LoopItem>
         *this)

{
  int *piVar1;
  LoopItem *pLVar2;
  long lVar3;
  ulong uVar4;
  
  pLVar2 = (LoopItem *)operator_new((ulong)this->capacity_ * 0x18);
  if (MemoryRecord::AddAllocation(void*)::storage == '\0') {
    Array<Qentem::TemplateCore<char,Qentem::Value<char>,Qentem::StringStream<char>>::LoopItem>::
    allocate();
  }
  piVar1 = MemoryRecord::AddAllocation(void*)::storage;
  *MemoryRecord::AddAllocation(void*)::storage = *MemoryRecord::AddAllocation(void*)::storage + 1;
  piVar1[2] = piVar1[2] + 1;
  lVar3 = malloc_usable_size(pLVar2);
  piVar1 = MemoryRecord::AddAllocation(void*)::storage;
  uVar4 = lVar3 + *(long *)(MemoryRecord::AddAllocation(void*)::storage + 4);
  *(ulong *)(MemoryRecord::AddAllocation(void*)::storage + 4) = uVar4;
  if (*(ulong *)(piVar1 + 6) < uVar4) {
    *(ulong *)(piVar1 + 6) = uVar4;
  }
  this->storage_ = pLVar2;
  return pLVar2;
}

Assistant:

Type_T *allocate() {
        Type_T *new_storage = Memory::Allocate<Type_T>(Capacity());
        setStorage(new_storage);
        return new_storage;
    }